

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected.hpp
# Opt level: O0

void __thiscall
nonstd::expected_lite::detail::storage_t<char,_int,_true,_true>::storage_t
          (storage_t<char,_int,_true,_true> *this,storage_t<char,_int,_true,_true> *other)

{
  bool bVar1;
  value_type_conflict1 *e;
  error_type *e_00;
  storage_t<char,_int,_true,_true> *other_local;
  storage_t<char,_int,_true,_true> *this_local;
  
  bVar1 = storage_t_impl<char,_int>::has_value(&other->super_storage_t_impl<char,_int>);
  storage_t_impl<char,_int>::storage_t_impl(&this->super_storage_t_impl<char,_int>,bVar1);
  bVar1 = storage_t_impl<char,_int>::has_value(&this->super_storage_t_impl<char,_int>);
  if (bVar1) {
    e = storage_t_impl<char,_int>::value(&other->super_storage_t_impl<char,_int>);
    storage_t_impl<char,_int>::construct_value(&this->super_storage_t_impl<char,_int>,e);
  }
  else {
    e_00 = storage_t_impl<char,_int>::error(&other->super_storage_t_impl<char,_int>);
    storage_t_impl<char,_int>::construct_error(&this->super_storage_t_impl<char,_int>,e_00);
  }
  return;
}

Assistant:

storage_t( storage_t const & other )
        : storage_t_impl<T, E>( other.has_value() )
    {
        if ( this->has_value() ) this->construct_value( other.value() );
        else                     this->construct_error( other.error() );
    }